

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O0

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockBP(RleBpEncoder *this,WriteStream *writer)

{
  bitpacking_width_t width;
  data_ptr_t pdVar1;
  uint *in_RSI;
  uint *in_RDI;
  WriteStream *in_stack_ffffffffffffffd8;
  idx_t in_stack_ffffffffffffffe0;
  
  ParquetDecodeUtils::VarintEncode<unsigned_long>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  width = (bitpacking_width_t)((ulong)(in_RDI + 6) >> 0x38);
  data_ptr_cast<unsigned_int>(in_RDI + 0x106);
  ParquetDecodeUtils::BitPackAligned<unsigned_int>
            (in_RSI,(data_ptr_t)in_RDI,in_stack_ffffffffffffffe0,width);
  pdVar1 = data_ptr_cast<unsigned_int>(in_RDI + 0x106);
  (*(code *)**(undefined8 **)in_RSI)(in_RSI,pdVar1,((ulong)*in_RDI << 8) >> 3);
  in_RDI[0x206] = 0;
  in_RDI[0x207] = 0;
  return;
}

Assistant:

void WriteCurrentBlockBP(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(BP_BLOCK_SIZE / 8 << 1 | 1, writer); // (... | 1) signals BP run
		ParquetDecodeUtils::BitPackAligned(bp_block, data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE, bit_width);
		writer.WriteData(data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE * bit_width / 8);
		bp_block_count = 0;
	}